

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
Omega_h::any_cast<std::__cxx11::string&&>(any *operand)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  
  pbVar1 = any_cast<std::__cxx11::string>(operand);
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return pbVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_0040f748;
  __cxa_throw(puVar2,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

inline ValueType any_cast(any&& operand) {
  // https://cplusplus.github.io/LWG/lwg-active.html#2509
  using can_move = std::integral_constant<bool,
      std::is_move_constructible<ValueType>::value &&
          !std::is_lvalue_reference<ValueType>::value>;

  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return detail::any_cast_move_if_true<ValueType>(p, can_move());
}